

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void check_dtd_chain(DLword type)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint local_10;
  LispPTR onext;
  LispPTR next;
  DLword type_local;
  
  uVar1 = *(uint *)(DTDspace + (long)(int)((uint)type << 4) + (long)(int)((uint)type << 1) + 4);
  while( true ) {
    local_10 = uVar1 & 0xfffffff;
    if (local_10 == 0) {
      return;
    }
    if ((uVar1 & 1) != 0) break;
    if ((uVar1 & 0x8000000) != 0) {
      error("impossibly-big free pointer!");
    }
    if (type != (*(ushort *)((ulong)(MDStypetbl + (local_10 >> 9)) ^ 2) & 0x7ff)) {
      error("BAD cell in next dtdfree ");
      return;
    }
    pLVar2 = NativeAligned4FromLAddr(local_10);
    uVar1 = *pLVar2;
  }
  error("Free pointer is ODD!");
  return;
}

Assistant:

void check_dtd_chain(DLword type)
{
  LispPTR next, onext;

  onext = 0;
  next = ((struct dtd *)GetDTD(type))->dtd_free;
  next &= POINTERMASK;

  while (next != NIL) {
    if (next & 1) {
      error("Free pointer is ODD!");
      return;
    }

    if (next & 0x8000000) error("impossibly-big free pointer!");

    if (type != GetTypeNumber(next)) {
      error("BAD cell in next dtdfree ");
      return;
    }
    onext = next;
    next = *((LispPTR *)NativeAligned4FromLAddr(next));
    next &= POINTERMASK;
  }
}